

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

void lest::inform(location *where,text *expr)

{
  undefined8 uVar1;
  char unaff_BPL;
  void *unaff_R12;
  void *unaff_R13;
  void *local_140;
  void *local_120;
  location *local_d0;
  undefined1 *local_50;
  undefined1 local_40 [16];
  
  uVar1 = __cxa_rethrow();
  if (local_140 != unaff_R12) {
    operator_delete(local_140);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_d0 != where) {
    operator_delete(local_d0);
  }
  if (local_120 != unaff_R13) {
    operator_delete(local_120);
  }
  if (unaff_BPL != '\0') {
    __cxa_free_exception();
  }
  __cxa_end_catch();
  _Unwind_Resume(uVar1);
}

Assistant:

inline void inform( location where, text expr )
{
    try
    {
        throw;
    }
    catch( message const & )
    {
        throw;
    }
    catch( std::exception const & e )
    {
        throw unexpected{ where, expr, with_message( e.what() ) }; \
    }
    catch(...)
    {
        throw unexpected{ where, expr, "of unknown type" }; \
    }
}